

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O0

int VHASH_TestSpeedAlt(void *key,int len,int iter)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  uint64_t tagl_2;
  uint64_t tagl_1;
  int bytesRemaining16aligned;
  int bytesRemaining;
  uchar lastBlock [144];
  int alignedLn;
  int blcCnt;
  int i;
  uint64_t tagl;
  int dummy;
  undefined1 local_c8 [8];
  vmac_ctx_t *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff4c;
  uchar *in_stack_ffffffffffffff50;
  int local_24;
  int local_14;
  
  local_14 = 0;
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    if ((in_ESI & 0xf) == 0) {
      uVar3 = vhash((uchar *)lastBlock._48_8_,lastBlock._44_4_,(uint64_t *)lastBlock._32_8_,
                    (vmac_ctx_t *)lastBlock._24_8_);
      iVar1 = (int)uVar3;
    }
    else {
      iVar1 = ((int)in_ESI / 0x80) * 0x80;
      if (iVar1 != 0) {
        vhash_update(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
      }
      iVar2 = (int)in_ESI % 0x80;
      memcpy(local_c8,(void *)(in_RDI + iVar1),(long)iVar2);
      memset(local_c8 + iVar2,0,(long)(((iVar2 >> 4) * 0x10 + 0x10) - iVar2));
      uVar3 = vhash((uchar *)lastBlock._48_8_,lastBlock._44_4_,(uint64_t *)lastBlock._32_8_,
                    (vmac_ctx_t *)lastBlock._24_8_);
      iVar1 = (int)uVar3;
    }
    local_14 = local_14 + iVar1;
  }
  return local_14;
}

Assistant:

int VHASH_TestSpeedAlt( const void * key, int len, int iter )
{
	int dummy = 0;
    uint64_t tagl;
	for ( int i=0; i<iter; i++ )
	{
		if (len & 0xF)
		{
			int blcCnt = len / VMAC_NHBYTES;
			int alignedLn = blcCnt * VMAC_NHBYTES;

			if (alignedLn) 
				vhash_update((unsigned char*)key, alignedLn, &(vhi.ctx));

			ALIGN(16) unsigned char lastBlock[VMAC_NHBYTES + 16];
			int bytesRemaining = len - alignedLn;
			memcpy(lastBlock, (unsigned char*)key + alignedLn, bytesRemaining);
			int bytesRemaining16aligned = ( ( bytesRemaining >> 4) << 4 ) + 16;
			memset(lastBlock + bytesRemaining, 0, bytesRemaining16aligned - bytesRemaining );

			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			dummy += vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			dummy += vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
		else // size is a multiple of 16
		{
			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			*(uint64_t*)res = vhash((unsigned char *)lastBlock, bytesRemaining + 1, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			dummy += vhash((unsigned char *)key, len, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
	}
	return dummy;
}